

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::details::
read_and_send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,details *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,descriptor *fd)

{
  ssize_t sVar1;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  undefined1 local_470 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eo;
  not_null<void_*> local_448;
  undefined1 local_440 [16];
  array<unsigned_char,_1024UL> buffer;
  
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)sender;
  memset(&buffer,0,0x400);
  local_448.ptr_ = &buffer;
  pstore::gsl::not_null<void_*>::ensure_invariant(&local_448);
  sVar1 = romfs::descriptor::read((descriptor *)io._M_data,(int)local_448.ptr_,(void *)0x1,0x400);
  if (sVar1 == 0) {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>&,void>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                *)__return_storage_ptr__,&io_local);
  }
  else {
    pstore::gsl::span<const_unsigned_char,_-1L>::span
              ((span<const_unsigned_char,__1L> *)local_440,buffer._M_elems,buffer._M_elems + sVar1);
    send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&eo,(http *)this,sender,
               (descriptor<pstore::details::posix_descriptor_traits> *)local_440,
               (span<const_unsigned_char,__1L> *)fd);
    if (eo.has_error_ == true) {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::error_or(__return_storage_ptr__,&eo);
    }
    else {
      std::__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2> *)local_470,
                 (__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2> *)io._M_data);
      read_and_send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,this,sender,
                 (descriptor<pstore::details::posix_descriptor_traits> *)local_470,fd);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468);
    }
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&eo);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> read_and_send (Sender sender, IO io,
                                                pstore::romfs::descriptor fd) {
                std::array<std::uint8_t, 1024> buffer{{0}};
                auto * const data = buffer.data ();
                std::size_t const num_read =
                    fd.read (data, sizeof (decltype (buffer)::value_type), buffer.size ());
                if (num_read == 0) {
                    return pstore::error_or<IO>{io};
                }
                pstore::error_or<IO> const eo =
                    send (sender, io, gsl::span<std::uint8_t const> (data, data + num_read));
                if (!eo) {
                    return eo;
                }
                return read_and_send (sender, io, fd);
            }